

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O1

void __thiscall
ADE_DEP_DPFSP::stampa(ADE_DEP_DPFSP *this,Permutazione **popolazione,unsigned_short nIndividui)

{
  ostream *poVar1;
  undefined6 in_register_00000012;
  ulong uVar2;
  long lVar3;
  
  if ((int)CONCAT62(in_register_00000012,nIndividui) != 0) {
    uVar2 = 0;
    do {
      if (0 < (int)((uint)(this->istanza).lavori + (uint)(this->istanza).fabbriche + -1)) {
        lVar3 = 0;
        do {
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          lVar3 = lVar3 + 1;
        } while (lVar3 < (long)((ulong)(this->istanza).lavori + (ulong)(this->istanza).fabbriche +
                               -1));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      (*(this->super_ADE<Permutazione>)._vptr_ADE[7])(this,popolazione[uVar2]);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
    } while (uVar2 != nIndividui);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

void ADE_DEP_DPFSP::stampa(Permutazione** popolazione, unsigned short nIndividui) {

	for (int i = 0; i < nIndividui; i++) {

		for (int j = 0; j < istanza.lavori + istanza.fabbriche - 1; j++) {
			cout << popolazione[i]->individuo[j] << " ";
		}

		cout << ":" << "\t" << valutaIndividuo(popolazione[i]) << endl;
	}

	cout << endl;
}